

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O3

int __thiscall particleSamples::decide_to_pick_anti_particles(particleSamples *this,int monval)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = this->particle_monval;
  if (iVar2 == 0x270c) {
    iVar2 = particle_decay::get_particle_strange_number(this->decayer_ptr,monval);
    uVar1 = (uint)(0 < iVar2);
  }
  else {
    if (iVar2 == 0x270d) {
      uVar1 = particle_decay::get_particle_baryon_number(this->decayer_ptr,monval);
    }
    else {
      if (iVar2 != 0x270e) {
        return (uint)(iVar2 + monval == 0);
      }
      uVar1 = particle_decay::get_particle_charge(this->decayer_ptr,monval);
    }
    uVar1 = uVar1 >> 0x1f;
  }
  return uVar1;
}

Assistant:

int particleSamples::decide_to_pick_anti_particles(int monval) {
    // this function judge whether particle is the anti-particle of the
    // particle of interest
    int pick_flag = 0;
    if (particle_monval == 9998) {
        // anti-particles for all positive charged hadrons
        // pick all negative charged hadrons
        int charge = decayer_ptr->get_particle_charge(monval);
        if (charge < 0) {
            pick_flag = 1;
        }
    } else if (particle_monval == 9997) {
        // anti-particles for all baryons:
        // pick all anti-baryons
        int baryon = decayer_ptr->get_particle_baryon_number(monval);
        if (baryon < 0) {
            pick_flag = 1;
        }
    } else if (particle_monval == 9996) {
        // anti-particles for all strangness particles:
        // pick all anti-strangness particles
        int strange = decayer_ptr->get_particle_strange_number(monval);
        if (strange > 0) {
            pick_flag = 1;
        }
    } else {
        // for identified particle: pick its anti-particle
        if (particle_monval == -monval) {
            pick_flag = 1;
        }
    }
    return (pick_flag);
}